

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readTiled1.cpp
# Opt level: O0

void readTiledOtherVersions(char *fileName)

{
  int iVar1;
  char *in_RDI;
  int tileYMax;
  int tileYMin;
  int tileXMax;
  int tileXMin;
  int levelY;
  int levelX;
  int tileY;
  int tileX;
  TiledInputFile in;
  TiledInputFile *in_stack_ffffffffffffff90;
  TiledInputFile local_28 [40];
  
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile(local_28,in_RDI,iVar1);
  Imf_3_4::TiledInputFile::readTile((int)local_28,0,0,0);
  Imf_3_4::TiledInputFile::readTiles((int)local_28,0,0,0,0,0);
  Imf_3_4::TiledInputFile::~TiledInputFile(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
readTiledOtherVersions (const char fileName[])
{
    // read tile function versions
    TiledInputFile in(fileName);
    int tileX = 0, tileY = 0, levelX = 0, levelY = 0;
    int tileXMin = 0, tileXMax = 0, tileYMin = 0, tileYMax = 0;
    // [begin v1]
    in.readTile (tileX, tileY, levelX, levelY);
    // [end v1]
    in.readTiles (tileXMin, tileXMax, tileYMin, tileYMax, levelX, levelY);
    // [end v2]
}